

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

void __thiscall
QNetworkAccessBackend::QNetworkAccessBackend
          (QNetworkAccessBackend *this,TargetTypes targetTypes,SecurityFeatures securityFeatures,
          IOFeatures ioFeatures)

{
  long lVar1;
  QObjectPrivate *pQVar2;
  QNetworkAccessBackendPrivate *pQVar3;
  Int in_ECX;
  Int in_EDX;
  Int in_ESI;
  QNetworkAccessBackendPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessBackendPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QObjectPrivate *)operator_new(0xb8);
  QNetworkAccessBackendPrivate::QNetworkAccessBackendPrivate(in_RDI);
  QObject::QObject((QObject *)in_RDI,pQVar2,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00499af8;
  pQVar3 = d_func((QNetworkAccessBackend *)0x187fc1);
  (pQVar3->m_targetTypes).super_QFlagsStorageHelper<QNetworkAccessBackend::TargetType,_4>.
  super_QFlagsStorage<QNetworkAccessBackend::TargetType>.i = in_ESI;
  (pQVar3->m_securityFeatures).super_QFlagsStorageHelper<QNetworkAccessBackend::SecurityFeature,_4>.
  super_QFlagsStorage<QNetworkAccessBackend::SecurityFeature>.i = in_EDX;
  (pQVar3->m_ioFeatures).super_QFlagsStorageHelper<QNetworkAccessBackend::IOFeature,_4>.
  super_QFlagsStorage<QNetworkAccessBackend::IOFeature>.i = in_ECX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessBackend::QNetworkAccessBackend(TargetTypes targetTypes,
                                             SecurityFeatures securityFeatures,
                                             IOFeatures ioFeatures)
    : QObject(*(new QNetworkAccessBackendPrivate), nullptr)
{
    Q_D(QNetworkAccessBackend);
    d->m_targetTypes = targetTypes;
    d->m_securityFeatures = securityFeatures;
    d->m_ioFeatures = ioFeatures;
}